

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O1

void __thiscall
vkt::memory::anon_unknown_0::SubmitRenderPass::logPrepare
          (SubmitRenderPass *this,TestLog *log,size_t commandIndex)

{
  long *plVar1;
  pointer ppRVar2;
  long *plVar3;
  size_type *psVar4;
  ulong uVar5;
  string sectionName;
  ScopedLogSection section;
  long *local_1f8;
  long local_1f0;
  long local_1e8;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  string local_1d8;
  long *local_1b8 [2];
  long local_1a8 [2];
  ScopedLogSection local_198 [14];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::ostream::_M_insert<unsigned_long>((ulong)local_198);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base(local_128);
  plVar1 = (long *)std::__cxx11::string::append((char *)local_1b8);
  plVar3 = plVar1 + 2;
  if ((long *)*plVar1 == plVar3) {
    local_1e8 = *plVar3;
    uStack_1e0 = (undefined4)plVar1[3];
    uStack_1dc = *(undefined4 *)((long)plVar1 + 0x1c);
    local_1f8 = &local_1e8;
  }
  else {
    local_1e8 = *plVar3;
    local_1f8 = (long *)*plVar1;
  }
  local_1f0 = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  (*(this->super_CmdCommand)._vptr_CmdCommand[2])(this);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_1f8);
  psVar4 = (size_type *)(plVar1 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar1 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_1d8.field_2._M_allocated_capacity = *psVar4;
    local_1d8.field_2._8_8_ = plVar1[3];
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  }
  else {
    local_1d8.field_2._M_allocated_capacity = *psVar4;
    local_1d8._M_dataplus._M_p = (pointer)*plVar1;
  }
  local_1d8._M_string_length = plVar1[1];
  *plVar1 = (long)psVar4;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  if (local_1f8 != &local_1e8) {
    operator_delete(local_1f8,local_1e8 + 1);
  }
  if (local_1b8[0] != local_1a8) {
    operator_delete(local_1b8[0],local_1a8[0] + 1);
  }
  tcu::ScopedLogSection::ScopedLogSection(local_198,log,&local_1d8,&local_1d8);
  ppRVar2 = (this->m_commands).
            super__Vector_base<vkt::memory::(anonymous_namespace)::RenderPassCommand_*,_std::allocator<vkt::memory::(anonymous_namespace)::RenderPassCommand_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_commands).
      super__Vector_base<vkt::memory::(anonymous_namespace)::RenderPassCommand_*,_std::allocator<vkt::memory::(anonymous_namespace)::RenderPassCommand_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppRVar2) {
    uVar5 = 0;
    do {
      (*ppRVar2[uVar5]->_vptr_RenderPassCommand[3])(ppRVar2[uVar5],log,uVar5);
      uVar5 = uVar5 + 1;
      ppRVar2 = (this->m_commands).
                super__Vector_base<vkt::memory::(anonymous_namespace)::RenderPassCommand_*,_std::allocator<vkt::memory::(anonymous_namespace)::RenderPassCommand_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar5 < (ulong)((long)(this->m_commands).
                                   super__Vector_base<vkt::memory::(anonymous_namespace)::RenderPassCommand_*,_std::allocator<vkt::memory::(anonymous_namespace)::RenderPassCommand_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppRVar2 >> 3))
    ;
  }
  tcu::TestLog::endSection(local_198[0].m_log);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void SubmitRenderPass::logPrepare (TestLog& log, size_t commandIndex) const
{
	const string				sectionName	(de::toString(commandIndex) + ":" + getName());
	const tcu::ScopedLogSection	section		(log, sectionName, sectionName);

	for (size_t cmdNdx = 0; cmdNdx < m_commands.size(); cmdNdx++)
	{
		RenderPassCommand& command = *m_commands[cmdNdx];
		command.logPrepare(log, cmdNdx);
	}
}